

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall bloaty::RangeMapTest_Bug1_Test::RangeMapTest_Bug1_Test(RangeMapTest_Bug1_Test *this)

{
  RangeMapTest *in_RDI;
  
  RangeMapTest::RangeMapTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__RangeMapTest_Bug1_Test_00914df8;
  return;
}

Assistant:

TEST_F(RangeMapTest, Bug1) {
  map_.AddRange(100, 20, "foo");
  map_.AddRange(120, 20, "bar");
  map_.AddRange(100, 15, "baz");
  AssertMainMapEquals({
    {100, 120, kNoTranslation, "foo"},
    {120, 140, kNoTranslation, "bar"},
  });
}